

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env.cpp
# Opt level: O0

vec4 vera::getFaceViewport(int _size,int _faceId)

{
  int _faceId_local;
  int _size_local;
  
  if (_faceId == 0) {
    glm::vec<4,_float,_(glm::qualifier)0>::vec
              ((vec<4,_float,_(glm::qualifier)0> *)&_faceId_local,(float)_size * 2.0,(float)_size,
               (float)_size,(float)_size);
  }
  else if (_faceId == 1) {
    glm::vec<4,_float,_(glm::qualifier)0>::vec
              ((vec<4,_float,_(glm::qualifier)0> *)&_faceId_local,0.0,(float)_size,(float)_size,
               (float)_size);
  }
  else if (_faceId == 2) {
    glm::vec<4,_float,_(glm::qualifier)0>::vec
              ((vec<4,_float,_(glm::qualifier)0> *)&_faceId_local,(float)_size,(float)_size * 2.0,
               (float)_size,(float)_size);
  }
  else if (_faceId == 3) {
    glm::vec<4,_float,_(glm::qualifier)0>::vec
              ((vec<4,_float,_(glm::qualifier)0> *)&_faceId_local,(float)_size,0.0,(float)_size,
               (float)_size);
  }
  else if (_faceId == 4) {
    glm::vec<4,_float,_(glm::qualifier)0>::vec
              ((vec<4,_float,_(glm::qualifier)0> *)&_faceId_local,(float)_size,(float)_size,
               (float)_size,(float)_size);
  }
  else if (_faceId == 5) {
    glm::vec<4,_float,_(glm::qualifier)0>::vec
              ((vec<4,_float,_(glm::qualifier)0> *)&_faceId_local,(float)_size * 3.0,(float)_size,
               (float)_size,(float)_size);
  }
  else {
    glm::vec<4,_float,_(glm::qualifier)0>::vec
              ((vec<4,_float,_(glm::qualifier)0> *)&_faceId_local,0.0,0.0,(float)_size,(float)_size)
    ;
  }
  return __faceId_local;
}

Assistant:

glm::vec4 getFaceViewport(int _size, int _faceId) {
    if (_faceId == 0) 
        return glm::vec4((float)_size * 2.0f,   (float)_size,       (float)_size, (float)_size);
    else if (_faceId == 1) 
        return glm::vec4(0.0f,                  (float)_size,       (float)_size, (float)_size);
    else if (_faceId == 2) 
        return glm::vec4((float)_size,          (float)_size * 2.f, (float)_size, (float)_size);
    else if (_faceId == 3) 
        return glm::vec4((float)_size,          0.0f,               (float)_size, (float)_size);
    else if (_faceId == 4) 
        return glm::vec4((float)_size,          (float)_size,       (float)_size, (float)_size);
    else if (_faceId == 5)
        return glm::vec4((float)_size * 3.0f,   (float)_size,       (float)_size, (float)_size);

    return glm::vec4(0.0f, 0.0f, (float)_size, (float)_size);
}